

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_insert.cpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::DuckCatalog::PlanInsert
          (DuckCatalog *this,ClientContext *context,PhysicalPlanGenerator *planner,LogicalInsert *op
          ,optional_ptr<duckdb::PhysicalOperator,_true> plan)

{
  vector<duckdb::LogicalType,_true> *args;
  bool bVar1;
  OnConflictAction OVar2;
  bool bVar3;
  bool bVar4;
  int32_t iVar5;
  PhysicalOperator *pPVar6;
  TaskScheduler *this_00;
  optional_ptr<duckdb::PhysicalOperator,_true> plan_local;
  reference_wrapper<duckdb::PhysicalOperator> local_48;
  idx_t *local_40;
  vector<duckdb::LogicalType,_true> *local_38;
  
  plan_local = plan;
  pPVar6 = optional_ptr<duckdb::PhysicalOperator,_true>::operator*(&plan_local);
  bVar3 = PhysicalPlanGenerator::PreserveInsertionOrder(context,pPVar6);
  pPVar6 = optional_ptr<duckdb::PhysicalOperator,_true>::operator*(&plan_local);
  bVar4 = PhysicalPlanGenerator::UseBatchIndex(context,pPVar6);
  this_00 = TaskScheduler::GetScheduler(context);
  iVar5 = TaskScheduler::NumberOfThreads(this_00);
  bVar1 = op->return_chunk;
  OVar2 = op->action_type;
  if ((op->column_index_map).internal_vector.
      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (op->column_index_map).internal_vector.
      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pPVar6 = optional_ptr<duckdb::PhysicalOperator,_true>::operator*(&plan_local);
    plan_local.ptr = PhysicalPlanGenerator::ResolveDefaultsProjection(planner,op,pPVar6);
  }
  args = &(op->super_LogicalOperator).types;
  if ((OVar2 == THROW) && ((bVar4 & (bVar1 ^ 1U) & bVar3) != 0)) {
    pPVar6 = PhysicalPlanGenerator::
             Make<duckdb::PhysicalBatchInsert,duckdb::vector<duckdb::LogicalType,true>&,duckdb::TableCatalogEntry&,duckdb::vector<duckdb::unique_ptr<duckdb::BoundConstraint,std::default_delete<duckdb::BoundConstraint>,true>,true>,unsigned_long&>
                       (planner,args,op->table,&op->bound_constraints,
                        &(op->super_LogicalOperator).estimated_cardinality);
    local_48._M_data = optional_ptr<duckdb::PhysicalOperator,_true>::operator*(&plan_local);
  }
  else {
    local_38 = &op->set_types;
    local_40 = &(op->super_LogicalOperator).estimated_cardinality;
    local_48._M_data._0_1_ = 1 < iVar5 & OVar2 != UPDATE & ((bVar3 | bVar1) ^ 1U);
    pPVar6 = PhysicalPlanGenerator::
             Make<duckdb::PhysicalInsert,duckdb::vector<duckdb::LogicalType,true>&,duckdb::TableCatalogEntry&,duckdb::vector<duckdb::unique_ptr<duckdb::BoundConstraint,std::default_delete<duckdb::BoundConstraint>,true>,true>,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::vector<duckdb::PhysicalIndex,true>,duckdb::vector<duckdb::LogicalType,true>,unsigned_long&,bool&,bool,duckdb::OnConflictAction&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,duckdb::vector<unsigned_long,true>,bool&>
                       (planner,args,op->table,&op->bound_constraints,
                        &(op->super_LogicalOperator).expressions,&op->set_columns,local_38,local_40,
                        &op->return_chunk,(bool *)&local_48,&op->action_type,
                        &op->on_conflict_condition,&op->do_update_condition,&op->on_conflict_filter,
                        &op->columns_to_fetch,&op->update_is_del_and_insert);
    local_48._M_data = optional_ptr<duckdb::PhysicalOperator,_true>::operator*(&plan_local);
  }
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
  ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
              *)&pPVar6->children,&local_48);
  return pPVar6;
}

Assistant:

PhysicalOperator &DuckCatalog::PlanInsert(ClientContext &context, PhysicalPlanGenerator &planner, LogicalInsert &op,
                                          optional_ptr<PhysicalOperator> plan) {
	D_ASSERT(plan);
	bool parallel_streaming_insert = !PhysicalPlanGenerator::PreserveInsertionOrder(context, *plan);
	bool use_batch_index = PhysicalPlanGenerator::UseBatchIndex(context, *plan);
	auto num_threads = TaskScheduler::GetScheduler(context).NumberOfThreads();
	if (op.return_chunk) {
		// not supported for RETURNING (yet?)
		parallel_streaming_insert = false;
		use_batch_index = false;
	}
	if (op.action_type != OnConflictAction::THROW) {
		// We don't support ON CONFLICT clause in batch insertion operation currently
		use_batch_index = false;
	}
	if (op.action_type == OnConflictAction::UPDATE) {
		// When we potentially need to perform updates, we have to check that row is not updated twice
		// that currently needs to be done for every chunk, which would add a huge bottleneck to parallelized insertion
		parallel_streaming_insert = false;
	}
	if (!op.column_index_map.empty()) {
		plan = planner.ResolveDefaultsProjection(op, *plan);
	}
	if (use_batch_index && !parallel_streaming_insert) {
		auto &insert = planner.Make<PhysicalBatchInsert>(op.types, op.table, std::move(op.bound_constraints),
		                                                 op.estimated_cardinality);
		insert.children.push_back(*plan);
		return insert;
	}

	auto &insert = planner.Make<PhysicalInsert>(
	    op.types, op.table, std::move(op.bound_constraints), std::move(op.expressions), std::move(op.set_columns),
	    std::move(op.set_types), op.estimated_cardinality, op.return_chunk,
	    parallel_streaming_insert && num_threads > 1, op.action_type, std::move(op.on_conflict_condition),
	    std::move(op.do_update_condition), std::move(op.on_conflict_filter), std::move(op.columns_to_fetch),
	    op.update_is_del_and_insert);
	insert.children.push_back(*plan);
	return insert;
}